

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O2

uchar * __thiscall phosg::SHA1::SHA1(SHA1 *this,uchar *d,size_t n,uchar *md)

{
  size_t sVar1;
  uchar *extraout_RAX;
  long lVar2;
  size_t z;
  ulong uVar3;
  StringWriter w;
  anon_class_8_1_8991fb9c process_block;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  anon_class_8_1_8991fb9c local_28;
  
  this->h[0] = 0x67452301;
  this->h[1] = 0xefcdab89;
  this->h[2] = 0x98badcfe;
  this->h[3] = 0x10325476;
  this->h[4] = 0xc3d2e1f0;
  local_28.this = this;
  for (lVar2 = 0; lVar2 + 0x3fU < n; lVar2 = lVar2 + 0x40) {
    SHA1::anon_class_8_1_8991fb9c::operator()(&local_28,d + lVar2);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  StringWriter::write((StringWriter *)&local_48,(int)d + (int)lVar2,(void *)(n - lVar2),(size_t)md);
  StringWriter::put_u8((StringWriter *)&local_48,0x80);
  sVar1 = StringWriter::size((StringWriter *)&local_48);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&local_48,(ulong)(0x38 < sVar1) * 0x40 + 0x40,'\0');
  sVar1 = StringWriter::size((StringWriter *)&local_48);
  StringWriter::pput_u64b((StringWriter *)&local_48,sVar1 - 8,n << 3);
  uVar3 = 0;
  while( true ) {
    sVar1 = StringWriter::size((StringWriter *)&local_48);
    if (sVar1 <= uVar3) break;
    SHA1::anon_class_8_1_8991fb9c::operator()(&local_28,local_48._M_dataplus._M_p + uVar3);
    uVar3 = uVar3 + 0x40;
  }
  ::std::__cxx11::string::~string((string *)&local_48);
  return extraout_RAX;
}

Assistant:

SHA1::SHA1(const void* data, size_t size) {
  this->h[0] = 0x67452301;
  this->h[1] = 0xEFCDAB89;
  this->h[2] = 0x98BADCFE;
  this->h[3] = 0x10325476;
  this->h[4] = 0xC3D2E1F0;

  auto process_block = [this](const void* block) -> void {
    uint32_t extended_fields[80];
    memcpy(extended_fields, block, 0x40);
#ifdef PHOSG_LITTLE_ENDIAN
    for (size_t x = 0; x < 16; x++) {
      extended_fields[x] = bswap32(extended_fields[x]);
    }
#endif

    for (size_t x = 16; x < 80; x++) {
      uint32_t z = extended_fields[x - 3] ^ extended_fields[x - 8] ^ extended_fields[x - 14] ^ extended_fields[x - 16];
      extended_fields[x] = (z << 1) | ((z >> 31) & 1);
    }

    uint32_t a = this->h[0], b = this->h[1], c = this->h[2], d = this->h[3], e = this->h[4];
    for (size_t x = 0; x < 80; x++) {
      uint32_t f, k;
      if (x < 20) {
        f = (b & c) | ((~b) & d);
        k = 0x5A827999;
      } else if (x < 40) {
        f = b ^ c ^ d;
        k = 0x6ED9EBA1;
      } else if (x < 60) {
        f = (b & c) | (b & d) | (c & d);
        k = 0x8F1BBCDC;
      } else {
        f = b ^ c ^ d;
        k = 0xCA62C1D6;
      }

      uint32_t new_a = ((a << 5) | ((a >> 27) & 0x1F)) + f + e + k + extended_fields[x];
      e = d;
      d = c;
      c = (b << 30) | ((b >> 2) & 0x3FFFFFFF);
      b = a;
      a = new_a;
    }

    this->h[0] += a;
    this->h[1] += b;
    this->h[2] += c;
    this->h[3] += d;
    this->h[4] += e;
  };

  // Process all possible blocks from the input until just before the end
  size_t processed_offset;
  for (processed_offset = 0; processed_offset + 0x3F < size; processed_offset += 0x40) {
    process_block(reinterpret_cast<const uint8_t*>(data) + processed_offset);
  }

  // Make a copy of the last (possibly incomplete) block, append the trailer,
  // and process what remains. This could result in either one or two blocks.
  StringWriter w;
  w.write(reinterpret_cast<const char*>(data) + processed_offset, size - processed_offset);
  {
    w.put_u8(0x80);
    w.extend_to((w.size() > 0x38) ? 0x80 : 0x40, '\0');
    w.pput_u64b(w.size() - 8, size << 3);
  }
  for (size_t z = 0; z < w.size(); z += 0x40) {
    process_block(w.str().data() + z);
  }
}